

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall
SolverTest_SolutionStubOption_Test::SolverTest_SolutionStubOption_Test
          (SolverTest_SolutionStubOption_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__SolverTest_SolutionStubOption_Test_00398c80;
  return;
}

Assistant:

TEST(SolverTest, SolutionStubOption) {
  SolCountingSolver s1(false);
  EXPECT_THROW(s1.GetStrOption("solutionstub"), OptionError);
  SolCountingSolver s2(true);
  EXPECT_EQ("", s2.GetStrOption("solutionstub"));
  s2.SetStrOption("solutionstub", "abc");
  EXPECT_EQ("abc", s2.GetStrOption("solutionstub"));
}